

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_MemCmp_Test::testBody(TEST_SimpleString_MemCmp_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  undefined4 local_18;
  undefined4 local_14;
  uchar greater [4];
  uchar smaller [4];
  TEST_SimpleString_MemCmp_Test *this_local;
  
  local_14 = 0xff2a0100;
  local_18 = 0xffff0100;
  _greater = this;
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp(&local_14,&local_14,4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)iVar1,
             "LONGS_EQUAL(0, SimpleString::MemCmp(smaller, smaller, sizeof(smaller))) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x45e,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp(&local_14,&local_18,4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 < 0),"CHECK",
             "SimpleString::MemCmp(smaller, greater, sizeof(smaller)) < 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x45f,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp(&local_18,&local_14,4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(0 < iVar1),"CHECK",
             "SimpleString::MemCmp(greater, smaller, sizeof(smaller)) > 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x460,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp((void *)0x0,(void *)0x0,0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)iVar1,"LONGS_EQUAL(0, SimpleString::MemCmp(NULLPTR, NULLPTR, 0)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x461,pTVar3);
  return;
}

Assistant:

TEST(SimpleString, MemCmp)
{
    unsigned char smaller[] = { 0x00, 0x01, 0x2A, 0xFF };
    unsigned char greater[] = { 0x00, 0x01, 0xFF, 0xFF };

    LONGS_EQUAL(0, SimpleString::MemCmp(smaller, smaller, sizeof(smaller)));
    CHECK(SimpleString::MemCmp(smaller, greater, sizeof(smaller)) < 0);
    CHECK(SimpleString::MemCmp(greater, smaller, sizeof(smaller)) > 0);
    LONGS_EQUAL(0, SimpleString::MemCmp(NULLPTR, NULLPTR, 0));
}